

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_colored_printf_(int color,char *fmt,...)

{
  char *local_148;
  char *col_str;
  char local_138 [4];
  int n;
  char buffer [256];
  va_list args;
  char *fmt_local;
  int color_local;
  
  buffer[0xfc] = '0';
  buffer[0xfd] = '\0';
  buffer[0xfe] = '\0';
  buffer[0xff] = '\0';
  buffer[0xf8] = '\x10';
  buffer[0xf9] = '\0';
  buffer[0xfa] = '\0';
  buffer[0xfb] = '\0';
  vsnprintf(local_138,0x100,fmt,buffer + 0xf8);
  buffer[0xf7] = '\0';
  if (acutest_colorize_ == 0) {
    fmt_local._4_4_ = printf("%s",local_138);
  }
  else {
    switch(color) {
    case 1:
      local_148 = "\x1b[0;32m";
      break;
    case 2:
      local_148 = "\x1b[0;31m";
      break;
    case 3:
      local_148 = "\x1b[1m";
      break;
    case 4:
      local_148 = "\x1b[1;32m";
      break;
    case 5:
      local_148 = "\x1b[1;31m";
      break;
    default:
      local_148 = "\x1b[0m";
    }
    printf("%s",local_148);
    fmt_local._4_4_ = printf("%s",local_138);
    printf("\x1b[0m");
  }
  return fmt_local._4_4_;
}

Assistant:

acutest_colored_printf_(int color, const char* fmt, ...)
{
    va_list args;
    char buffer[256];
    int n;

    va_start(args, fmt);
    vsnprintf(buffer, sizeof(buffer), fmt, args);
    va_end(args);
    buffer[sizeof(buffer)-1] = '\0';

    if(!acutest_colorize_) {
        return printf("%s", buffer);
    }

#if defined ACUTEST_UNIX_
    {
        const char* col_str;
        switch(color) {
            case ACUTEST_COLOR_GREEN_:              col_str = "\033[0;32m"; break;
            case ACUTEST_COLOR_RED_:                col_str = "\033[0;31m"; break;
            case ACUTEST_COLOR_GREEN_INTENSIVE_:    col_str = "\033[1;32m"; break;
            case ACUTEST_COLOR_RED_INTENSIVE_:      col_str = "\033[1;31m"; break;
            case ACUTEST_COLOR_DEFAULT_INTENSIVE_:  col_str = "\033[1m"; break;
            default:                                col_str = "\033[0m"; break;
        }
        printf("%s", col_str);
        n = printf("%s", buffer);
        printf("\033[0m");
        return n;
    }
#elif defined ACUTEST_WIN_
    {
        HANDLE h;
        CONSOLE_SCREEN_BUFFER_INFO info;
        WORD attr;

        h = GetStdHandle(STD_OUTPUT_HANDLE);
        GetConsoleScreenBufferInfo(h, &info);

        switch(color) {
            case ACUTEST_COLOR_GREEN_:              attr = FOREGROUND_GREEN; break;
            case ACUTEST_COLOR_RED_:                attr = FOREGROUND_RED; break;
            case ACUTEST_COLOR_GREEN_INTENSIVE_:    attr = FOREGROUND_GREEN | FOREGROUND_INTENSITY; break;
            case ACUTEST_COLOR_RED_INTENSIVE_:      attr = FOREGROUND_RED | FOREGROUND_INTENSITY; break;
            case ACUTEST_COLOR_DEFAULT_INTENSIVE_:  attr = FOREGROUND_BLUE | FOREGROUND_GREEN | FOREGROUND_RED | FOREGROUND_INTENSITY; break;
            default:                                attr = 0; break;
        }
        if(attr != 0)
            SetConsoleTextAttribute(h, attr);
        n = printf("%s", buffer);
        SetConsoleTextAttribute(h, info.wAttributes);
        return n;
    }
#else
    n = printf("%s", buffer);
    return n;
#endif
}